

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filter.c
# Opt level: O0

_Bool ecs_filter_next(ecs_iter_t *it)

{
  ecs_sparse_t *sparse;
  _Bool _Var1;
  int32_t iVar2;
  ecs_table_t *table_00;
  ecs_data_t *peVar3;
  ecs_entity_t *peVar4;
  ecs_data_t *data;
  ecs_table_t *table;
  int32_t i;
  int32_t count;
  ecs_sparse_t *tables;
  ecs_filter_iter_t *iter;
  ecs_iter_t *it_local;
  
  sparse = (it->iter).filter.tables;
  iVar2 = ecs_sparse_count(sparse);
  table._0_4_ = (it->iter).parent.index;
  while( true ) {
    if (iVar2 <= (int32_t)table) {
      return false;
    }
    table_00 = (ecs_table_t *)_ecs_sparse_get(sparse,0x80,(int32_t)table);
    _ecs_assert(table_00 != (ecs_table_t *)0x0,0xc,(char *)0x0,"table != NULL",
                "/workspace/llm4binary/github/license_all_cmakelists_25/duddel[P]flecs-lab/build_O0/flecs-clone-prefix/src/flecs-clone/src/filter.c"
                ,0x1e);
    if (table_00 == (ecs_table_t *)0x0) break;
    peVar3 = ecs_table_get_data(table_00);
    if ((peVar3 != (ecs_data_t *)0x0) &&
       (_Var1 = ecs_table_match_filter(it->world,table_00,&(it->iter).parent.filter), _Var1)) {
      (it->iter).parent.table.table = table_00;
      it->table = (ecs_iter_table_t *)((long)&it->iter + 0x28);
      it->table_columns = peVar3->columns;
      iVar2 = ecs_table_count(table_00);
      it->count = iVar2;
      peVar4 = (ecs_entity_t *)_ecs_vector_first(peVar3->entities,8,0x10);
      it->entities = peVar4;
      (it->iter).parent.index = (int32_t)table + 1;
      return true;
    }
    table._0_4_ = (int32_t)table + 1;
  }
  __assert_fail("table != ((void*)0)",
                "/workspace/llm4binary/github/license_all_cmakelists_25/duddel[P]flecs-lab/build_O0/flecs-clone-prefix/src/flecs-clone/src/filter.c"
                ,0x1e,"_Bool ecs_filter_next(ecs_iter_t *)");
}

Assistant:

bool ecs_filter_next(
    ecs_iter_t *it)
{
    ecs_filter_iter_t *iter = &it->iter.filter;
    ecs_sparse_t *tables = iter->tables;
    int32_t count = ecs_sparse_count(tables);
    int32_t i;

    for (i = iter->index; i < count; i ++) {
        ecs_table_t *table = ecs_sparse_get(tables, ecs_table_t, i);
        ecs_assert(table != NULL, ECS_INTERNAL_ERROR, NULL);
        
        ecs_data_t *data = ecs_table_get_data(table);

        if (!data) {
            continue;
        }

        if (!ecs_table_match_filter(it->world, table, &iter->filter)) {
            continue;
        }

        iter->table.table = table;
        it->table = &iter->table;
        it->table_columns = data->columns;
        it->count = ecs_table_count(table);
        it->entities = ecs_vector_first(data->entities, ecs_entity_t);
        iter->index = i + 1;

        return true;
    }

    return false;
}